

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitvec * sqlite3BitvecCreate(u32 iSize)

{
  Bitvec *pBVar1;
  
  pBVar1 = (Bitvec *)sqlite3MallocZero(0x200);
  if (pBVar1 != (Bitvec *)0x0) {
    pBVar1->iSize = iSize;
  }
  return pBVar1;
}

Assistant:

SQLITE_PRIVATE Bitvec *sqlite3BitvecCreate(u32 iSize){
  Bitvec *p;
  assert( sizeof(*p)==BITVEC_SZ );
  p = sqlite3MallocZero( sizeof(*p) );
  if( p ){
    p->iSize = iSize;
  }
  return p;
}